

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O2

void __thiscall
Histogram<unsigned_int>::export_histogram(Histogram<unsigned_int> *this,string *file_name)

{
  uint bin;
  uint uVar1;
  ulong uVar2;
  allocator_type local_91;
  string *local_90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  data;
  string local_68;
  vector<double,_std::allocator<double>_> row;
  
  data.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = file_name;
  for (uVar1 = 0; uVar1 <= this->_bins; uVar1 = uVar1 + 1) {
    uVar2 = (ulong)uVar1;
    if ((this->_histogram).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] != 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &row.super__Vector_base<double,_std::allocator<double>_>,2,&local_91);
      *row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = (double)uVar2;
      row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = (double)(this->_histogram).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar2] / (double)this->_count;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&data,(value_type *)&row.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&row.super__Vector_base<double,_std::allocator<double>_>);
    }
  }
  std::__cxx11::string::string((string *)&local_68,(string *)local_90);
  io::save<double>(&data,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&data);
  return;
}

Assistant:

virtual void export_histogram(std::string file_name) const {
        std::vector<std::vector<double> > data;

        for (unsigned int bin = 0; bin <= _bins; bin++)
        {
            if (_histogram[bin] > 0) {
                std::vector<double> row(2);
                row[0] = bin;
                row[1] = _histogram[bin]*1./_count;
                data.push_back(row);
            }
        }
        io::save(data, file_name);
    }